

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TabBarProcessReorder(ImGuiTabBar *tab_bar)

{
  ushort uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImGuiTabItem *__src;
  float fVar5;
  float fVar6;
  ImGuiID IVar7;
  ImGuiTabItemFlags IVar8;
  int iVar9;
  int iVar10;
  ImGuiTabItem *it;
  ImGuiTabItem *pIVar11;
  ushort uVar12;
  ImGuiTabItem *__dest;
  ImGuiTabItem item_tmp;
  undefined3 uStack_2b;
  undefined5 uStack_28;
  
  it = TabBarFindTabByID(tab_bar,tab_bar->ReorderRequestTabId);
  if ((it != (ImGuiTabItem *)0x0) && ((it->Flags & 0x20) == 0)) {
    iVar10 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,it);
    iVar10 = tab_bar->ReorderRequestOffset + iVar10;
    if ((-1 < iVar10) && (iVar10 < (tab_bar->Tabs).Size)) {
      pIVar11 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar10);
      if (((pIVar11->Flags & 0x20U) == 0) && (((pIVar11->Flags ^ it->Flags) & 0xc0U) == 0)) {
        uVar2._0_2_ = it->BeginOrder;
        uVar2._2_2_ = it->IndexDuringLayout;
        uVar2._4_1_ = it->WantClose;
        uVar2._5_3_ = *(undefined3 *)&it->field_0x25;
        uStack_28 = (undefined5)uVar2;
        IVar7 = it->ID;
        IVar8 = it->Flags;
        iVar10 = it->LastFrameVisible;
        iVar9 = it->LastFrameSelected;
        fVar5 = it->Offset;
        fVar6 = it->Width;
        uVar3 = it->ContentWidth;
        uVar4 = it->NameOffset;
        uStack_2b = (undefined3)((uint)uVar4 >> 8);
        uVar1 = tab_bar->ReorderRequestOffset;
        __dest = pIVar11 + 1;
        __src = pIVar11;
        if (0 < (short)uVar1) {
          __dest = it;
          __src = it + 1;
        }
        uVar12 = -uVar1;
        if (0 < (short)uVar1) {
          uVar12 = uVar1;
        }
        memmove(__dest,__src,(ulong)uVar12 * 0x28);
        *(ulong *)((long)&pIVar11->NameOffset + 1) = CONCAT53(uStack_28,uStack_2b);
        pIVar11->Offset = fVar5;
        pIVar11->Width = fVar6;
        pIVar11->ContentWidth = (float)uVar3;
        pIVar11->NameOffset = uVar4;
        pIVar11->ID = IVar7;
        pIVar11->Flags = IVar8;
        pIVar11->LastFrameVisible = iVar10;
        pIVar11->LastFrameSelected = iVar9;
        if ((tab_bar->Flags & 0x400000) != 0) {
          MarkIniSettingsDirty();
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ImGui::TabBarProcessReorder(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId);
    if (tab1 == NULL || (tab1->Flags & ImGuiTabItemFlags_NoReorder))
        return false;

    //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
    int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestOffset;
    if (tab2_order < 0 || tab2_order >= tab_bar->Tabs.Size)
        return false;

    // Reordered tabs must share the same section
    // (Note: TabBarQueueReorderFromMousePos() also has a similar test but since we allow direct calls to TabBarQueueReorder() we do it here too)
    ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
    if (tab2->Flags & ImGuiTabItemFlags_NoReorder)
        return false;
    if ((tab1->Flags & ImGuiTabItemFlags_SectionMask_) != (tab2->Flags & ImGuiTabItemFlags_SectionMask_))
        return false;

    ImGuiTabItem item_tmp = *tab1;
    ImGuiTabItem* src_tab = (tab_bar->ReorderRequestOffset > 0) ? tab1 + 1 : tab2;
    ImGuiTabItem* dst_tab = (tab_bar->ReorderRequestOffset > 0) ? tab1 : tab2 + 1;
    const int move_count = (tab_bar->ReorderRequestOffset > 0) ? tab_bar->ReorderRequestOffset : -tab_bar->ReorderRequestOffset;
    memmove(dst_tab, src_tab, move_count * sizeof(ImGuiTabItem));
    *tab2 = item_tmp;

    if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
        MarkIniSettingsDirty();
    return true;
}